

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O1

void __thiscall QGraphicsItem::setScale(QGraphicsItem *this,qreal factor)

{
  undefined1 *puVar1;
  QGraphicsItemPrivate *pQVar2;
  TransformData *pTVar3;
  long lVar4;
  qreal *pqVar5;
  TransformData *pTVar6;
  long in_FS_OFFSET;
  byte bVar7;
  double local_90;
  QVariant local_88;
  QVariant local_68;
  anon_union_24_3_e3d07ef4_for_data local_48;
  undefined1 *puStack_30;
  long local_20;
  
  bVar7 = 0;
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  prepareGeometryChange(this);
  local_90 = factor;
  if ((((this->d_ptr).d)->field_0x165 & 8) != 0) {
    local_48._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
    local_48.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
    local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    ::QVariant::QVariant(&local_68,factor);
    (*this->_vptr_QGraphicsItem[0x21])(&local_48,this,0x1e,&local_68);
    ::QVariant::~QVariant(&local_68);
    local_90 = (double)::QVariant::toReal((bool *)local_48.data);
    ::QVariant::~QVariant((QVariant *)&local_48);
  }
  pQVar2 = (this->d_ptr).d;
  if (pQVar2->transformData == (TransformData *)0x0) {
    pTVar3 = (TransformData *)operator_new(0x90);
    pqVar5 = (qreal *)&DAT_00700e28;
    pTVar6 = pTVar3;
    for (lVar4 = 9; lVar4 != 0; lVar4 = lVar4 + -1) {
      (pTVar6->transform).m_matrix[0][0] = *pqVar5;
      pqVar5 = pqVar5 + (ulong)bVar7 * -2 + 1;
      pTVar6 = (TransformData *)((long)pTVar6 + (ulong)bVar7 * -0x10 + 8);
    }
    puVar1 = &(pTVar3->transform).field_0x48;
    *(ushort *)puVar1 = *(ushort *)puVar1 & 0xfc00;
    pTVar3->scale = 1.0;
    pTVar3->rotation = 0.0;
    pTVar3->xOrigin = 0.0;
    pTVar3->yOrigin = 0.0;
    (pTVar3->graphicsTransforms).d.d = (Data *)0x0;
    (pTVar3->graphicsTransforms).d.ptr = (QGraphicsTransform **)0x0;
    (pTVar3->graphicsTransforms).d.size = 0;
    pTVar3->onlyTransform = true;
    pQVar2->transformData = pTVar3;
  }
  pTVar6 = pQVar2->transformData;
  if ((pTVar6->scale != local_90) || (NAN(pTVar6->scale) || NAN(local_90))) {
    pTVar6->scale = local_90;
    pTVar6->onlyTransform = false;
    pQVar2->field_0x166 = pQVar2->field_0x166 | 0x20;
    if ((*(ulong *)&((this->d_ptr).d)->field_0x160 & 0x80000000000) != 0) {
      ::QVariant::QVariant((QVariant *)&local_48,local_90);
      (*this->_vptr_QGraphicsItem[0x21])(&local_88,this,0x1f);
      ::QVariant::~QVariant(&local_88);
      ::QVariant::~QVariant((QVariant *)&local_48);
    }
    if ((((this->d_ptr).d)->field_0x167 & 1) != 0) {
      QMetaObject::activate
                ((QObject *)(this + -1),&QGraphicsObject::staticMetaObject,8,(void **)0x0);
    }
    (*((this->d_ptr).d)->_vptr_QGraphicsItemPrivate[4])();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsItem::setScale(qreal factor)
{
    prepareGeometryChange();
    qreal newScale = factor;

    if (d_ptr->flags & ItemSendsGeometryChanges) {
        // Notify the item that the scale is changing.
        const QVariant newScaleVariant(itemChange(ItemScaleChange, factor));
        newScale = newScaleVariant.toReal();
    }

    if (!d_ptr->transformData)
        d_ptr->transformData = new QGraphicsItemPrivate::TransformData;

    if (d_ptr->transformData->scale == newScale)
        return;

    d_ptr->transformData->scale = newScale;
    d_ptr->transformData->onlyTransform = false;
    d_ptr->dirtySceneTransform = 1;

    // Send post-notification.
    if (d_ptr->flags & ItemSendsGeometryChanges)
        itemChange(ItemScaleHasChanged, newScale);

    if (d_ptr->isObject)
        emit static_cast<QGraphicsObject *>(this)->scaleChanged();

    d_ptr->transformChanged();
}